

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

bool __thiscall VcprojGenerator::openOutput(VcprojGenerator *this,QFile *file,QString *param_2)

{
  long lVar1;
  QMakeProject *pQVar2;
  bool bVar3;
  ProKey *this_00;
  char *pcVar4;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  ProKey local_188;
  ProKey local_158;
  ProKey local_128;
  ProString local_f8;
  ProString local_c8;
  ProString extension;
  ProString fileName;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fileName.m_file = -0x55555556;
  fileName._36_4_ = 0xaaaaaaaa;
  fileName.m_hash._0_4_ = 0xaaaaaaaa;
  fileName.m_hash._4_4_ = 0xaaaaaaaa;
  fileName.m_string.d.size._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.size._4_4_ = 0xaaaaaaaa;
  fileName.m_offset = -0x55555556;
  fileName.m_length = -0x55555556;
  fileName.m_string.d.d._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.d._4_4_ = 0xaaaaaaaa;
  fileName.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
  fileName.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)file + 0xe8))(&extension);
  ProString::ProString(&fileName,&extension.m_string);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&extension);
  extension.m_file = -0x55555556;
  extension._36_4_ = 0xaaaaaaaa;
  extension.m_hash = 0xaaaaaaaaaaaaaaaa;
  extension.m_string.d.size = -0x5555555555555556;
  extension.m_offset = -0x55555556;
  extension.m_length = -0x55555556;
  extension.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  extension.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_f8,"TEMPLATE");
  QMakeEvaluator::first(&local_c8,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_f8);
  bVar3 = ProString::operator==(&local_c8,"vcsubdirs");
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  if (bVar3) {
    pcVar4 = "VCSOLUTION_EXTENSION";
  }
  else {
    pcVar4 = "VCPROJ_EXTENSION";
  }
  ProKey::ProKey(&local_128,pcVar4);
  QMakeEvaluator::first(&extension,&pQVar2->super_QMakeEvaluator,&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  bVar3 = ProString::endsWith(&fileName,&extension,CaseSensitive);
  if (!bVar3) {
    if (fileName.m_length == 0) {
      pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_128,"MAKEFILE");
      QMakeEvaluator::first(&local_f8,&pQVar2->super_QMakeEvaluator,&local_128);
      pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      if (local_f8.m_length == 0) {
        this_00 = &local_188;
        pcVar4 = "TARGET";
      }
      else {
        pcVar4 = "MAKEFILE";
        this_00 = &local_158;
      }
      ProKey::ProKey(this_00,pcVar4);
      QMakeEvaluator::first(&local_c8,&pQVar2->super_QMakeEvaluator,this_00);
      ProString::operator=(&fileName,&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      if (local_f8.m_length == 0) {
        this_01 = (QArrayDataPointer<char16_t> *)&local_188;
      }
      else {
        this_01 = (QArrayDataPointer<char16_t> *)&local_158;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    }
    local_f8.m_string.d.d = (Data *)&fileName;
    local_f8.m_string.d.ptr = (char16_t *)&extension;
    QStringBuilder<ProString_&,_ProString_&>::convertTo<QString>
              (&local_c8.m_string,(QStringBuilder<ProString_&,_ProString_&> *)&local_f8);
    QFile::setFileName((QString *)file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  }
  local_c8.m_string.d.d = (Data *)0x0;
  local_c8.m_string.d.ptr = (char16_t *)0x0;
  local_c8.m_string.d.size = 0;
  bVar3 = MakefileGenerator::openOutput((MakefileGenerator *)this,file,&local_c8.m_string);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&extension);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fileName);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::openOutput(QFile &file, const QString &/*build*/) const
{
    ProString fileName = file.fileName();
    ProString extension = project->first("TEMPLATE") == "vcsubdirs"
            ? project->first("VCSOLUTION_EXTENSION") : project->first("VCPROJ_EXTENSION");
    if (!fileName.endsWith(extension)) {
        if (fileName.isEmpty()) {
            fileName = !project->first("MAKEFILE").isEmpty()
                    ? project->first("MAKEFILE") : project->first("TARGET");
        }
        file.setFileName(fileName + extension);
    }
    return Win32MakefileGenerator::openOutput(file, QString());
}